

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O2

bool Js::AsmJsFunctionDeclaration::Is(AsmJsSymbol *sym)

{
  byte bVar1;
  
  if ((sym == (AsmJsSymbol *)0x0) || (ClosureFunction < sym->mType)) {
    bVar1 = 0;
  }
  else {
    bVar1 = (byte)(0xb70 >> ((byte)sym->mType & 0x1f));
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool AsmJsFunctionDeclaration::Is(AsmJsSymbol* sym)
    {
        return (
            AsmJsFunc::Is(sym) ||
            AsmJsFunctionTable::Is(sym) ||
            AsmJsImportFunction::Is(sym) ||
            AsmJsMathFunction::Is(sym) ||
            AsmJsTypedArrayFunction::Is(sym) ||
            AsmJsClosureFunction::Is(sym)
        );
    }